

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint RDL_getFamiliesContainingNode_internal(RDL_data *data,RDL_node object,uint **ptr,char family)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  }
  else {
    if (object < data->graph->V) {
      if (data->nofURFs != 0) {
        puVar1 = RDL_listFamilies(data,object,'a',family);
        *ptr = puVar1;
        uVar3 = 0xffffffff;
        do {
          uVar2 = (int)uVar3 + 1;
          uVar3 = (ulong)uVar2;
        } while (puVar1[uVar3] != 0xffffffff);
        return uVar2;
      }
      uVar2 = 0;
      goto LAB_00107614;
    }
    (*RDL_outputFunc)(RDL_ERROR,"invalid node: %u\n");
  }
  uVar2 = 0xffffffff;
LAB_00107614:
  puVar1 = (uint *)malloc(4);
  *ptr = puVar1;
  return uVar2;
}

Assistant:

static unsigned RDL_getFamiliesContainingNode_internal(
    const RDL_data *data, RDL_node object, unsigned **ptr,
    char family)
{
  unsigned i;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (object >= data->graph->V) {
    RDL_outputFunc(RDL_ERROR, "invalid node: %u\n", object);
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  *ptr = RDL_listFamilies(data, object, 'a', family);
  for(i=0; (*ptr)[i]<UINT_MAX; ++i);
  return i;
}